

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall trompeloeil::sequence_matcher::retire_predecessors(sequence_matcher *this)

{
  sequence_type::retire_until(*(sequence_type **)(this + 0x40),this);
  return;
}

Assistant:

void
    retire_predecessors()
    noexcept
    {
      seq.retire_until(this);
    }